

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O0

ElementIndexHeader * __thiscall
adios2::format::BP4Base::ReadElementIndexHeader
          (BP4Base *this,vector<char,_std::allocator<char>_> *buffer,size_t *position,
          bool isLittleEndian)

{
  char cVar1;
  uint8_t uVar2;
  uint uVar3;
  unsigned_long uVar4;
  vector<char,_std::allocator<char>_> *in_RSI;
  ElementIndexHeader *in_RDI;
  ElementIndexHeader *header;
  size_t *in_stack_ffffffffffffff68;
  ElementIndexHeader *buffer_00;
  string *this_00;
  string local_68 [15];
  undefined1 in_stack_ffffffffffffffa7;
  size_t *in_stack_ffffffffffffffa8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  BPBase *in_stack_ffffffffffffffb8;
  
  buffer_00 = in_RDI;
  BPBase::ElementIndexHeader::ElementIndexHeader(in_RDI);
  uVar3 = helper::ReadValue<unsigned_int>
                    ((vector<char,_std::allocator<char>_> *)buffer_00,in_stack_ffffffffffffff68,
                     false);
  in_RDI->Length = uVar3;
  uVar3 = helper::ReadValue<unsigned_int>
                    ((vector<char,_std::allocator<char>_> *)buffer_00,in_stack_ffffffffffffff68,
                     false);
  in_RDI->MemberID = uVar3;
  this_00 = (string *)&stack0xffffffffffffffb8;
  BPBase::ReadBPString_abi_cxx11_
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (bool)in_stack_ffffffffffffffa7);
  std::__cxx11::string::operator=((string *)&in_RDI->GroupName,this_00);
  std::__cxx11::string::~string(this_00);
  BPBase::ReadBPString_abi_cxx11_
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (bool)in_stack_ffffffffffffffa7);
  std::__cxx11::string::operator=((string *)&in_RDI->Name,local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::operator=((string *)&in_RDI->Path,"");
  cVar1 = helper::ReadValue<char>
                    ((vector<char,_std::allocator<char>_> *)buffer_00,in_stack_ffffffffffffff68,
                     false);
  in_RDI->Order = cVar1;
  helper::ReadValue<unsigned_char>
            ((vector<char,_std::allocator<char>_> *)buffer_00,in_stack_ffffffffffffff68,false);
  uVar2 = helper::ReadValue<signed_char>
                    ((vector<char,_std::allocator<char>_> *)buffer_00,in_stack_ffffffffffffff68,
                     false);
  in_RDI->DataType = uVar2;
  uVar4 = helper::ReadValue<unsigned_long>
                    (in_RSI,(size_t *)this_00,SUB81((ulong)buffer_00 >> 0x38,0));
  in_RDI->CharacteristicsSetsCount = uVar4;
  return buffer_00;
}

Assistant:

BP4Base::ElementIndexHeader
BP4Base::ReadElementIndexHeader(const std::vector<char> &buffer, size_t &position,
                                const bool isLittleEndian) const noexcept
{
    ElementIndexHeader header;
    header.Length = helper::ReadValue<uint32_t>(buffer, position, isLittleEndian);
    header.MemberID = helper::ReadValue<uint32_t>(buffer, position, isLittleEndian);
    header.GroupName = ReadBPString(buffer, position, isLittleEndian);
    header.Name = ReadBPString(buffer, position, isLittleEndian);
    // header.Path = ReadBP4String(buffer, position, isLittleEndian);
    header.Path = "";
    header.Order = helper::ReadValue<char>(buffer, position, isLittleEndian);
    // uint8_t unused =
    helper::ReadValue<uint8_t>(buffer, position, isLittleEndian);

    header.DataType = helper::ReadValue<int8_t>(buffer, position, isLittleEndian);
    header.CharacteristicsSetsCount = helper::ReadValue<uint64_t>(buffer, position, isLittleEndian);

    return header;
}